

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Fts5ExprNode *
sqlite3Fts5ParseNode
          (Fts5Parse *pParse,int eType,Fts5ExprNode *pLeft,Fts5ExprNode *pRight,
          Fts5ExprNearset *pNear)

{
  uint uVar1;
  Fts5ExprPhrase *pFVar2;
  int iVar3;
  Fts5ExprNode *p;
  code *pcVar4;
  ulong uVar5;
  ulong uVar6;
  char *pcVar7;
  Fts5ExprNearset *pNear_1;
  
  if (pParse->rc != 0) {
LAB_001baa4c:
    sqlite3Fts5ParseNodeFree(pLeft);
    sqlite3Fts5ParseNodeFree(pRight);
    sqlite3Fts5ParseNearsetFree(pNear);
    return (Fts5ExprNode *)0x0;
  }
  if (eType == 9 && pNear == (Fts5ExprNearset *)0x0) {
    return (Fts5ExprNode *)0x0;
  }
  if (eType != 9 && pLeft == (Fts5ExprNode *)0x0) {
    return pRight;
  }
  if (eType != 9 && pRight == (Fts5ExprNode *)0x0) {
    return pLeft;
  }
  if (eType == 3) {
    iVar3 = 2;
  }
  else {
    iVar3 = 0;
    if (eType - 1U < 2) {
      if (pLeft->eType == eType) {
        iVar3 = pLeft->nChild + 1;
      }
      else {
        iVar3 = 2;
      }
      if (pRight->eType == eType) {
        iVar3 = iVar3 + pRight->nChild + -1;
      }
    }
  }
  p = (Fts5ExprNode *)sqlite3Fts5MallocZero(&pParse->rc,(long)iVar3 * 8 + 0x30);
  if (p == (Fts5ExprNode *)0x0) goto LAB_001baa4c;
  p->eType = eType;
  p->pNear = pNear;
  if (eType == 1) {
    pcVar4 = fts5ExprNodeNext_OR;
  }
  else {
    if (eType != 2) {
      if (eType == 9) {
        pcVar4 = fts5ExprNodeNext_STRING;
        if ((((pNear->nPhrase == 1) && (pFVar2 = pNear->apPhrase[0], pFVar2->nTerm == 1)) &&
            (pFVar2->aTerm[0].pSynonym == (Fts5ExprTerm *)0x0)) && (pFVar2->aTerm[0].bFirst == '\0')
           ) {
          p->eType = 4;
          pcVar4 = fts5ExprNodeNext_TERM;
        }
        p->xNext = pcVar4;
      }
      else {
        p->xNext = fts5ExprNodeNext_NOT;
        if (eType != 9) goto LAB_001bab6b;
      }
      uVar1 = pNear->nPhrase;
      uVar5 = 0;
      uVar6 = 0;
      if (0 < (int)uVar1) {
        uVar6 = (ulong)uVar1;
      }
      for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
        pNear->apPhrase[uVar5]->pNode = p;
        if (pNear->apPhrase[uVar5]->nTerm == 0) {
          p->xNext = (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0;
          p->eType = 0;
        }
      }
      if (pParse->pConfig->eDetail == 0) {
        return p;
      }
      if (uVar1 == 1) {
        pcVar7 = "phrase";
        iVar3 = pNear->apPhrase[0]->nTerm;
        if (iVar3 < 2) {
          if (iVar3 != 1) {
            return p;
          }
          if (pNear->apPhrase[0]->aTerm[0].bFirst == '\0') {
            return p;
          }
        }
      }
      else {
        pcVar7 = "NEAR";
      }
      pParse->rc = 1;
      pcVar7 = sqlite3_mprintf("fts5: %s queries are not supported (detail!=full)",pcVar7);
      pParse->zErr = pcVar7;
      sqlite3_free(p);
      goto LAB_001baa4c;
    }
    pcVar4 = fts5ExprNodeNext_AND;
  }
  p->xNext = pcVar4;
LAB_001bab6b:
  fts5ExprAddChildren(p,pLeft);
  fts5ExprAddChildren(p,pRight);
  return p;
}

Assistant:

static Fts5ExprNode *sqlite3Fts5ParseNode(
  Fts5Parse *pParse,              /* Parse context */
  int eType,                      /* FTS5_STRING, AND, OR or NOT */
  Fts5ExprNode *pLeft,            /* Left hand child expression */
  Fts5ExprNode *pRight,           /* Right hand child expression */
  Fts5ExprNearset *pNear          /* For STRING expressions, the near cluster */
){
  Fts5ExprNode *pRet = 0;

  if( pParse->rc==SQLITE_OK ){
    int nChild = 0;               /* Number of children of returned node */
    sqlite3_int64 nByte;          /* Bytes of space to allocate for this node */
 
    assert( (eType!=FTS5_STRING && !pNear)
         || (eType==FTS5_STRING && !pLeft && !pRight)
    );
    if( eType==FTS5_STRING && pNear==0 ) return 0;
    if( eType!=FTS5_STRING && pLeft==0 ) return pRight;
    if( eType!=FTS5_STRING && pRight==0 ) return pLeft;

    if( eType==FTS5_NOT ){
      nChild = 2;
    }else if( eType==FTS5_AND || eType==FTS5_OR ){
      nChild = 2;
      if( pLeft->eType==eType ) nChild += pLeft->nChild-1;
      if( pRight->eType==eType ) nChild += pRight->nChild-1;
    }

    nByte = sizeof(Fts5ExprNode) + sizeof(Fts5ExprNode*)*(nChild-1);
    pRet = (Fts5ExprNode*)sqlite3Fts5MallocZero(&pParse->rc, nByte);

    if( pRet ){
      pRet->eType = eType;
      pRet->pNear = pNear;
      fts5ExprAssignXNext(pRet);
      if( eType==FTS5_STRING ){
        int iPhrase;
        for(iPhrase=0; iPhrase<pNear->nPhrase; iPhrase++){
          pNear->apPhrase[iPhrase]->pNode = pRet;
          if( pNear->apPhrase[iPhrase]->nTerm==0 ){
            pRet->xNext = 0;
            pRet->eType = FTS5_EOF;
          }
        }

        if( pParse->pConfig->eDetail!=FTS5_DETAIL_FULL ){
          Fts5ExprPhrase *pPhrase = pNear->apPhrase[0];
          if( pNear->nPhrase!=1 
           || pPhrase->nTerm>1
           || (pPhrase->nTerm>0 && pPhrase->aTerm[0].bFirst)
          ){
            assert( pParse->rc==SQLITE_OK );
            pParse->rc = SQLITE_ERROR;
            assert( pParse->zErr==0 );
            pParse->zErr = sqlite3_mprintf(
                "fts5: %s queries are not supported (detail!=full)", 
                pNear->nPhrase==1 ? "phrase": "NEAR"
                );
            sqlite3_free(pRet);
            pRet = 0;
          }
        }
      }else{
        fts5ExprAddChildren(pRet, pLeft);
        fts5ExprAddChildren(pRet, pRight);
      }
    }
  }

  if( pRet==0 ){
    assert( pParse->rc!=SQLITE_OK );
    sqlite3Fts5ParseNodeFree(pLeft);
    sqlite3Fts5ParseNodeFree(pRight);
    sqlite3Fts5ParseNearsetFree(pNear);
  }
  return pRet;
}